

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

void Gia_Sim2Delete(Gia_Sim2_t *p)

{
  Vec_IntFreeP(&p->vClassOld);
  Vec_IntFreeP(&p->vClassNew);
  free(p->pDataSim);
  free(p);
  return;
}

Assistant:

void Gia_Sim2Delete( Gia_Sim2_t * p )
{
    Vec_IntFreeP( &p->vClassOld );
    Vec_IntFreeP( &p->vClassNew );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p );
}